

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall cmake::StartDebuggerIfEnabled(cmake *this)

{
  bool bVar1;
  byte bVar2;
  pointer this_00;
  runtime_error *error;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  cmake *local_18;
  cmake *this_local;
  
  local_18 = this;
  bVar1 = GetDebuggerOn(this);
  if ((bVar1) && (bVar1 = std::operator==(&this->DebugAdapter,(nullptr_t)0x0), bVar1)) {
    GetDebuggerPipe_abi_cxx11_(&local_38,this);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_38);
    if ((bVar2 & 1) != 0) {
      std::operator<<((ostream *)&std::cerr,
                      "Error: --debugger-pipe must be set when debugging is enabled.\n");
      return false;
    }
    GetDebuggerPipe_abi_cxx11_(&local_78,this);
    std::make_shared<cmDebugger::cmDebuggerPipeConnection_POSIX,std::__cxx11::string>(&local_58);
    GetDebuggerDapLogFile_abi_cxx11_((string *)&error,this);
    std::
    make_shared<cmDebugger::cmDebuggerAdapter,std::shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX>,std::__cxx11::string>
              ((shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX> *)&local_58.field_2,&local_58
              );
    std::shared_ptr<cmDebugger::cmDebuggerAdapter>::operator=
              (&this->DebugAdapter,(shared_ptr<cmDebugger::cmDebuggerAdapter> *)&local_58.field_2);
    std::shared_ptr<cmDebugger::cmDebuggerAdapter>::~shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerAdapter> *)&local_58.field_2);
    std::__cxx11::string::~string((string *)&error);
    std::shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX>::~shared_ptr
              ((shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX> *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::operator->
                        (&this->Messenger);
    cmMessenger::SetDebuggerAdapter(this_00,&this->DebugAdapter);
  }
  return true;
}

Assistant:

bool cmake::StartDebuggerIfEnabled()
{
  if (!this->GetDebuggerOn()) {
    return true;
  }

  if (DebugAdapter == nullptr) {
    if (this->GetDebuggerPipe().empty()) {
      std::cerr
        << "Error: --debugger-pipe must be set when debugging is enabled.\n";
      return false;
    }

    try {
      DebugAdapter = std::make_shared<cmDebugger::cmDebuggerAdapter>(
        std::make_shared<cmDebugger::cmDebuggerPipeConnection>(
          this->GetDebuggerPipe()),
        this->GetDebuggerDapLogFile());
    } catch (const std::runtime_error& error) {
      std::cerr << "Error: Failed to create debugger adapter.\n";
      std::cerr << error.what() << "\n";
      return false;
    }
    Messenger->SetDebuggerAdapter(DebugAdapter);
  }

  return true;
}